

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnknownModuleSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnknownModuleSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,basic_string_view<char,_std::char_traits<char>_> *args_2,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_3)

{
  string_view name;
  string_view moduleName;
  UnknownModuleSymbol *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_local_3;
  basic_string_view<char,_std::char_traits<char>_> *args_local_2;
  SourceLocation *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UnknownModuleSymbol *)allocate(this,0x90,8);
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  moduleName._M_len = args_2->_M_len;
  moduleName._M_str = args_2->_M_str;
  ast::UnknownModuleSymbol::UnknownModuleSymbol(this_00,name,*args_1,moduleName,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }